

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

Quaternion QuaternionFromAxisAngle(Vector3 axis,float angle)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  Quaternion QVar8;
  
  fVar6 = axis.z;
  fVar4 = axis.x;
  fVar5 = axis.y;
  fVar1 = fVar6 * fVar6 + fVar4 * fVar4 + fVar5 * fVar5;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar1 = 1.0 / fVar1;
    fVar2 = sinf(angle * 0.5);
    fVar3 = cosf(angle * 0.5);
    fVar7 = fVar4 * fVar1 * fVar2;
    fVar4 = fVar5 * fVar1 * fVar2;
    fVar2 = fVar1 * fVar6 * fVar2;
    fVar1 = fVar3 * fVar3 + fVar2 * fVar2 + fVar7 * fVar7 + fVar4 * fVar4;
    if (fVar1 < 0.0) {
      fVar1 = sqrtf(fVar1);
    }
    else {
      fVar1 = SQRT(fVar1);
    }
    fVar1 = (float)(-(uint)(fVar1 == 0.0) & 0x3f800000 |
                   ~-(uint)(fVar1 == 0.0) & (uint)(1.0 / fVar1));
    fVar7 = fVar7 * fVar1;
    fVar4 = fVar4 * fVar1;
    fVar2 = fVar2 * fVar1;
    fVar3 = fVar3 * fVar1;
  }
  else {
    fVar2 = 0.0;
    fVar3 = 1.0;
    fVar7 = 0.0;
    fVar4 = 0.0;
  }
  QVar8.y = fVar4;
  QVar8.x = fVar7;
  QVar8.w = fVar3;
  QVar8.z = fVar2;
  return QVar8;
}

Assistant:

RMAPI Quaternion QuaternionFromAxisAngle(Vector3 axis, float angle)
{
    Quaternion result = { 0.0f, 0.0f, 0.0f, 1.0f };

    float axisLength = sqrtf(axis.x*axis.x + axis.y*axis.y + axis.z*axis.z);

    if (axisLength != 0.0f)
    {
        angle *= 0.5f;

        float length = 0.0f;
        float ilength = 0.0f;

        // Vector3Normalize(axis)
        length = axisLength;
        if (length == 0.0f) length = 1.0f;
        ilength = 1.0f/length;
        axis.x *= ilength;
        axis.y *= ilength;
        axis.z *= ilength;

        float sinres = sinf(angle);
        float cosres = cosf(angle);

        result.x = axis.x*sinres;
        result.y = axis.y*sinres;
        result.z = axis.z*sinres;
        result.w = cosres;

        // QuaternionNormalize(q);
        Quaternion q = result;
        length = sqrtf(q.x*q.x + q.y*q.y + q.z*q.z + q.w*q.w);
        if (length == 0.0f) length = 1.0f;
        ilength = 1.0f/length;
        result.x = q.x*ilength;
        result.y = q.y*ilength;
        result.z = q.z*ilength;
        result.w = q.w*ilength;
    }

    return result;
}